

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResolvingDecoder.cc
# Opt level: O2

ProductionPtr __thiscall
avro::parsing::ResolvingGrammarGenerator::resolveRecords
          (ResolvingGrammarGenerator *this,NodePtr *writer,NodePtr *reader,
          map<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>_>,_std::allocator<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
          *m,map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
             *m2)

{
  vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *pvVar1;
  _func_int **pp_Var2;
  int iVar3;
  size_type __n;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
  __position;
  undefined4 extraout_var;
  map<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>_>,_std::allocator<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
  *m_00;
  undefined4 extraout_var_00;
  long *plVar4;
  void *__buf;
  iterator iVar5;
  NodePtr *n;
  size_t __n_00;
  shared_count extraout_RDX;
  pointer ppVar6;
  type tVar7;
  ProductionPtr PVar8;
  ProductionPtr p;
  NodePtr s;
  vector<unsigned_long,_std::allocator<unsigned_long>_> fieldOrder;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  rf;
  shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> defaultBinary;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  wf;
  pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_> local_130;
  element_type *local_110;
  any local_108;
  _Rb_tree<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>,_std::_Select1st<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>,_std::less<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>_>,_std::allocator<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
  *local_100;
  Symbol local_f8;
  NodePtr *local_e8;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_d8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  local_c0;
  shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> local_a8;
  element_type *local_98;
  shared_count local_90;
  _Base_ptr local_88;
  reverse_iterator<__gnu_cxx::__normal_iterator<avro::parsing::Symbol_*,_std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>
  local_80;
  reverse_iterator<__gnu_cxx::__normal_iterator<avro::parsing::Symbol_*,_std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>
  local_78;
  reverse_iterator<__gnu_cxx::__normal_iterator<avro::parsing::Symbol_*,_std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>
  local_70;
  reverse_iterator<__gnu_cxx::__normal_iterator<avro::parsing::Symbol_*,_std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>
  local_68;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  local_60;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  local_100 = (_Rb_tree<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>,_std::_Select1st<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>,_std::less<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>_>,_std::allocator<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
               *)m2;
  local_e8 = writer;
  tVar7 = boost::
          make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>();
  fields_abi_cxx11_(&local_60,(ResolvingGrammarGenerator *)reader,(NodePtr *)tVar7.pn.pi_.pi_);
  fields_abi_cxx11_(&local_c0,(ResolvingGrammarGenerator *)m,n);
  local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __n = (**(code **)(**(long **)&(m->_M_t)._M_impl + 0x38))();
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d8,__n);
  for (ppVar6 = local_60.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar6 != local_60.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar6 = ppVar6 + 1) {
    __position = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_long>*,std::vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_pred<avro::parsing::equalsFirst<std::__cxx11::string,unsigned_long>>>
                           (local_c0.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            local_c0.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,ppVar6);
    if (__position._M_current ==
        local_c0.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      iVar3 = (*reader->px->_vptr_Node[5])(reader->px,(ulong)(uint)ppVar6->second);
      getWriterProduction((ResolvingGrammarGenerator *)&local_130,local_e8,
                          (map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
                           *)CONCAT44(extraout_var_00,iVar3));
      local_110 = (element_type *)CONCAT44(local_110._4_4_,0x1b);
      local_108.content = (placeholder *)0x0;
      std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
      emplace_back<avro::parsing::Symbol>
                ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
                 (this->super_ValidatingGrammarGenerator)._vptr_ValidatingGrammarGenerator,
                 (Symbol *)&local_110);
      if ((_Base_ptr)local_108.content != (_Base_ptr)0x0) {
        (*(local_108.content)->_vptr_placeholder[1])();
      }
      pvVar1 = (vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               (this->super_ValidatingGrammarGenerator)._vptr_ValidatingGrammarGenerator;
      if (*(long *)&(local_130.first.px)->type_ - (long)(local_130.first.px)->_vptr_Node == 0x10) {
        std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
                  (pvVar1,(value_type *)(local_130.first.px)->_vptr_Node);
      }
      else {
        Symbol::indirect((Symbol *)&local_110,(ProductionPtr *)&local_130);
        std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
        emplace_back<avro::parsing::Symbol>(pvVar1,(Symbol *)&local_110);
        if ((_Base_ptr)local_108.content != (_Base_ptr)0x0) {
          (*(local_108.content)->_vptr_placeholder[1])();
        }
      }
    }
    else {
      iVar3 = (*reader->px->_vptr_Node[5])(reader->px,(ulong)(uint)ppVar6->second);
      plVar4 = *(long **)&(m->_M_t)._M_impl;
      m_00 = (map<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>_>,_std::allocator<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
              *)(**(code **)(*plVar4 + 0x28))(plVar4,(int)(__position._M_current)->second);
      doGenerate2((ResolvingGrammarGenerator *)&local_130,local_e8,
                  (NodePtr *)CONCAT44(extraout_var,iVar3),m_00,
                  (map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
                   *)local_100);
      local_68.current._M_current =
           *(__normal_iterator<avro::parsing::Symbol_*,_std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
             *)&(local_130.first.px)->type_;
      local_70.current._M_current =
           (__normal_iterator<avro::parsing::Symbol_*,_std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
            )(local_130.first.px)->_vptr_Node;
      std::
      copy<std::reverse_iterator<__gnu_cxx::__normal_iterator<avro::parsing::Symbol*,std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>,std::back_insert_iterator<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>
                (&local_68,&local_70,
                 (vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
                 (this->super_ValidatingGrammarGenerator)._vptr_ValidatingGrammarGenerator);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d8,
                 &(__position._M_current)->second);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ::erase(&local_c0,(const_iterator)__position._M_current);
    }
    boost::detail::shared_count::~shared_count(&local_130.first.pn);
  }
  local_88 = &(((_Rep_type *)&local_100->_M_impl)->_M_impl).super__Rb_tree_header._M_header;
  for (ppVar6 = local_c0.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar6 != local_c0.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar6 = ppVar6 + 1) {
    plVar4 = *(long **)&(m->_M_t)._M_impl;
    plVar4 = (long *)(**(code **)(*plVar4 + 0x28))(plVar4,(int)ppVar6->second);
    local_110 = (element_type *)*plVar4;
    local_108.content = (placeholder *)plVar4[1];
    if ((_Base_ptr)local_108.content != (_Base_ptr)0x0) {
      LOCK();
      *(int *)&((_Base_ptr)local_108.content)->_M_parent =
           *(int *)&((_Base_ptr)local_108.content)->_M_parent + 1;
      UNLOCK();
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d8,&ppVar6->second);
    if (local_110->type_ == AVRO_NUM_TYPES) {
      resolveSymbol((avro *)&local_130,(shared_ptr<avro::Node> *)&local_110);
      boost::shared_ptr<avro::Node>::operator=
                ((shared_ptr<avro::Node> *)&local_110,&local_130.first);
      boost::detail::shared_count::~shared_count(&local_130.first.pn);
    }
    plVar4 = *(long **)&(m->_M_t)._M_impl;
    __buf = (void *)(**(code **)(*plVar4 + 0x30))(plVar4,(int)ppVar6->second);
    binaryEncoder();
    memoryOutputStream((avro *)&local_f8,0x1000);
    (*(local_130.first.px)->_vptr_Node[2])
              (local_130.first.px,CONCAT44(local_f8._4_4_,local_f8.kind_));
    GenericWriter::write((int)local_130.first.px,__buf,__n_00);
    (*(local_130.first.px)->_vptr_Node[3])();
    snapshot((avro *)&local_98,(OutputStream *)CONCAT44(local_f8._4_4_,local_f8.kind_));
    if ((long *)CONCAT44(local_f8._4_4_,local_f8.kind_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_f8._4_4_,local_f8.kind_) + 8))();
    }
    boost::detail::shared_count::~shared_count(&local_130.first.pn);
    pvVar1 = (vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
             (this->super_ValidatingGrammarGenerator)._vptr_ValidatingGrammarGenerator;
    local_a8.px = local_98;
    local_a8.pn.pi_ = local_90.pi_;
    if (local_90.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_90.pi_)->use_count_ = (local_90.pi_)->use_count_ + 1;
      UNLOCK();
    }
    Symbol::defaultStartAction((Symbol *)&local_130,&local_a8);
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
    emplace_back<avro::parsing::Symbol>(pvVar1,(Symbol *)&local_130);
    if ((_Base_ptr)local_130.first.pn.pi_ != (_Base_ptr)0x0) {
      (*(local_130.first.pn.pi_)->_vptr_sp_counted_base[1])();
    }
    boost::detail::shared_count::~shared_count(&local_a8.pn);
    local_130.first.px = local_110;
    local_130.first.pn.pi_ = (sp_counted_base *)local_108.content;
    if ((_Base_ptr)local_108.content == (_Base_ptr)0x0) {
      local_130.second.pn.pi_ = (sp_counted_base *)0x0;
    }
    else {
      LOCK();
      *(int *)(local_108.content + 1) = *(int *)(local_108.content + 1) + 1;
      UNLOCK();
      local_130.second.pn.pi_ = (sp_counted_base *)local_108.content;
      if ((_Base_ptr)local_108.content != (_Base_ptr)0x0) {
        LOCK();
        *(int *)(local_108.content + 1) = *(int *)(local_108.content + 1) + 1;
        UNLOCK();
      }
    }
    local_130.second.px = local_110;
    iVar5 = std::
            _Rb_tree<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>,_std::_Select1st<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>,_std::less<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>_>,_std::allocator<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
            ::find(local_100,&local_130);
    std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>::~pair(&local_130);
    if (iVar5._M_node == local_88) {
      doGenerate2((ResolvingGrammarGenerator *)&local_130,local_e8,
                  (shared_ptr<avro::Node> *)&local_110,
                  (map<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>_>,_std::allocator<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
                   *)&local_110,
                  (map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
                   *)local_100);
    }
    else {
      local_130.first.px = *(element_type **)(iVar5._M_node + 2);
      local_130.first.pn.pi_ = (sp_counted_base *)iVar5._M_node[2]._M_parent;
      if ((_Base_ptr)local_130.first.pn.pi_ != (_Base_ptr)0x0) {
        LOCK();
        *(int *)&((_Base_ptr)local_130.first.pn.pi_)->_M_parent =
             *(int *)&((_Base_ptr)local_130.first.pn.pi_)->_M_parent + 1;
        UNLOCK();
      }
    }
    local_78.current._M_current =
         *(__normal_iterator<avro::parsing::Symbol_*,_std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
           *)&(local_130.first.px)->type_;
    local_80.current._M_current =
         (__normal_iterator<avro::parsing::Symbol_*,_std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
          )(local_130.first.px)->_vptr_Node;
    std::
    copy<std::reverse_iterator<__gnu_cxx::__normal_iterator<avro::parsing::Symbol*,std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>,std::back_insert_iterator<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>
              (&local_78,&local_80,
               (vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               (this->super_ValidatingGrammarGenerator)._vptr_ValidatingGrammarGenerator);
    local_f8.kind_ = sDefaultEnd;
    local_f8.extra_.content = (placeholder *)0x0;
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
    emplace_back<avro::parsing::Symbol>
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               (this->super_ValidatingGrammarGenerator)._vptr_ValidatingGrammarGenerator,&local_f8);
    if (local_f8.extra_.content != (placeholder *)0x0) {
      (*(local_f8.extra_.content)->_vptr_placeholder[1])();
    }
    boost::detail::shared_count::~shared_count(&local_130.first.pn);
    boost::detail::shared_count::~shared_count(&local_90);
    boost::detail::shared_count::~shared_count((shared_count *)&local_108);
  }
  pp_Var2 = (this->super_ValidatingGrammarGenerator)._vptr_ValidatingGrammarGenerator;
  std::
  __reverse<__gnu_cxx::__normal_iterator<avro::parsing::Symbol*,std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>
            (*pp_Var2,pp_Var2[1]);
  pvVar1 = (vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
           (this->super_ValidatingGrammarGenerator)._vptr_ValidatingGrammarGenerator;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d8);
  Symbol::sizeListAction
            ((Symbol *)&local_130,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48
            );
  std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
  emplace_back<avro::parsing::Symbol>(pvVar1,(Symbol *)&local_130);
  if ((_Base_ptr)local_130.first.pn.pi_ != (_Base_ptr)0x0) {
    (*(local_130.first.pn.pi_)->_vptr_sp_counted_base[1])();
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
  local_130.first.px = (element_type *)CONCAT44(local_130.first.px._4_4_,0x21);
  local_130.first.pn.pi_ = (sp_counted_base *)0x0;
  std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
  emplace_back<avro::parsing::Symbol>
            ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
             (this->super_ValidatingGrammarGenerator)._vptr_ValidatingGrammarGenerator,
             (Symbol *)&local_130);
  if (local_130.first.pn.pi_ != (sp_counted_base *)0x0) {
    (*(local_130.first.pn.pi_)->_vptr_sp_counted_base[1])();
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_d8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~vector(&local_c0);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~vector(&local_60);
  PVar8.pn.pi_ = extraout_RDX.pi_;
  PVar8.px = (element_type *)this;
  return PVar8;
}

Assistant:

ProductionPtr ResolvingGrammarGenerator::resolveRecords(
    const NodePtr& writer, const NodePtr& reader,
    map<NodePair, ProductionPtr>& m,
    map<NodePtr, ProductionPtr>& m2)
{
    ProductionPtr result = make_shared<Production>();

    vector<pair<string, size_t> > wf = fields(writer);
    vector<pair<string, size_t> > rf = fields(reader);
    vector<size_t> fieldOrder;
    fieldOrder.reserve(reader->names());

    /*
     * We look for all writer fields in the reader. If found, recursively
     * resolve the corresponding fields. Then erase the reader field.
     * If no matching field is found for reader, arrange to skip the writer
     * field.
     */
    for (vector<pair<string, size_t> >::const_iterator it = wf.begin();
        it != wf.end(); ++it) {
        vector<pair<string, size_t> >::iterator it2 =
            find_if(rf.begin(), rf.end(),
                equalsFirst<string, size_t>(it->first));
        if (it2 != rf.end()) {
            ProductionPtr p = doGenerate2(writer->leafAt(it->second),
                reader->leafAt(it2->second), m, m2);
            copy(p->rbegin(), p->rend(), back_inserter(*result));
            fieldOrder.push_back(it2->second);
            rf.erase(it2);
        } else {
            ProductionPtr p = getWriterProduction(
                writer->leafAt(it->second), m2);
            result->push_back(Symbol::skipStart());
            if (p->size() == 1) {
                result->push_back((*p)[0]);
            } else {
                result->push_back(Symbol::indirect(p));
            }
        }
    }

    /*
     * Examine the reader fields left out, (i.e. those didn't have corresponding
     * writer field).
     */
    for (vector<pair<string, size_t> >::const_iterator it = rf.begin();
        it != rf.end(); ++it) {

        NodePtr s = reader->leafAt(it->second);
        fieldOrder.push_back(it->second);

        if (s->type() == AVRO_SYMBOLIC) {
            s = resolveSymbol(s);
        }
        shared_ptr<vector<uint8_t> > defaultBinary =
            getAvroBinary(reader->defaultValueAt(it->second));
        result->push_back(Symbol::defaultStartAction(defaultBinary));
        map<NodePair, shared_ptr<Production> >::const_iterator it2 =
            m.find(NodePair(s, s));
        ProductionPtr p = (it2 == m.end()) ?
            doGenerate2(s, s, m, m2) : it2->second;
        copy(p->rbegin(), p->rend(), back_inserter(*result));
        result->push_back(Symbol::defaultEndAction());
    }
    reverse(result->begin(), result->end());
    result->push_back(Symbol::sizeListAction(fieldOrder));
    result->push_back(Symbol::recordAction());

    return result;

}